

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_ManComputeForwardCut(Of_Man_t *p,int iObj,int *pCut)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  uint *pCut_00;
  uint v;
  
  pCut_00 = (uint *)CONCAT44(in_register_00000034,iObj);
  iVar1 = p->pPars->nDelayLut1;
  uVar3 = 0;
  v = 0;
  do {
    uVar2 = *pCut_00 & 0x1f;
    if (uVar2 <= v) {
LAB_0060e8c6:
      pCut_00[(ulong)uVar2 + 1] = uVar3;
      return uVar3;
    }
    uVar2 = Of_CutVar((int *)pCut_00,v);
    if (uVar2 == 0) {
      uVar2 = *pCut_00 & 0x1f;
      goto LAB_0060e8c6;
    }
    uVar2 = p->pObjs[uVar2].Delay1 + iVar1;
    if ((int)uVar3 <= (int)uVar2) {
      uVar3 = uVar2;
    }
    v = v + 1;
  } while( true );
}

Assistant:

static inline int Of_ManComputeForwardCut( Of_Man_t * p, int iObj, int * pCut )
{
    int k, iVar, Delay = 0;
    int DelayLut1 = p->pPars->nDelayLut1;
    Of_CutForEachVar( pCut, iVar, k )
        Delay = Abc_MaxInt( Delay, Of_ObjDelay1(p, iVar) + DelayLut1 );
    Of_CutSetDelay1( pCut, Delay );
    return Delay;
}